

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplaceRealloc<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,pointer pos,SourceBuffer *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_t sVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pSVar9;
  pointer pSVar10;
  BufferID BVar11;
  undefined4 uVar12;
  pointer pSVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar3 = this->cap;
  if (uVar16 < uVar3 * 2) {
    uVar16 = uVar3 * 2;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    uVar16 = 0x3ffffffffffffff;
  }
  lVar17 = (long)pos - (long)this->data_;
  pSVar13 = (pointer)operator_new(uVar16 << 5);
  sVar4 = (args->data)._M_len;
  pcVar5 = (args->data)._M_str;
  uVar6 = *(undefined8 *)&args->id;
  puVar1 = (undefined8 *)((long)pSVar13 + lVar17 + 0x10);
  *puVar1 = args->library;
  puVar1[1] = uVar6;
  *(size_t *)((long)pSVar13 + lVar17) = sVar4;
  ((size_t *)((long)pSVar13 + lVar17))[1] = (size_t)pcVar5;
  p = this->data_;
  lVar14 = this->len * 0x20;
  lVar15 = (long)p + (lVar14 - (long)pos);
  pSVar9 = p;
  pSVar10 = pSVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->data)._M_len + lVar15);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->library + lVar15);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pSVar13->library + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&(pSVar13->data)._M_len + lVar15);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        lVar15 = lVar15 + 0x20;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pSVar9 != pos; pSVar9 = pSVar9 + 1) {
      sVar4 = (pSVar9->data)._M_len;
      pcVar5 = (pSVar9->data)._M_str;
      BVar11.id = (pSVar9->id).id;
      uVar12 = *(undefined4 *)&pSVar9->field_0x1c;
      pSVar10->library = pSVar9->library;
      pSVar10->id = (BufferID)BVar11.id;
      *(undefined4 *)&pSVar10->field_0x1c = uVar12;
      (pSVar10->data)._M_len = sVar4;
      (pSVar10->data)._M_str = pcVar5;
      pSVar10 = pSVar10 + 1;
    }
    memcpy((void *)((long)pSVar13 + lVar17 + 0x20),pos,(lVar15 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pSVar13;
  return (pointer)((long)pSVar13 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}